

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O2

Point3f __thiscall
pbrt::RealisticCamera::SampleExitPupil
          (RealisticCamera *this,Point2f *pFilm,Point2f *lensSample,Float *sampleBoundsArea)

{
  Bounds2<float> *pBVar1;
  size_t sVar2;
  bool bVar3;
  float fVar4;
  int iVar5;
  int iVar6;
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [64];
  undefined1 auVar12 [16];
  undefined1 in_ZMM2 [64];
  Point3f PVar13;
  Bounds2f pupilBounds;
  Bounds2<float> local_28;
  undefined1 extraout_var [56];
  
  fVar7 = (pFilm->super_Tuple2<pbrt::Point2,_float>).y;
  auVar9 = ZEXT416((uint)(pFilm->super_Tuple2<pbrt::Point2,_float>).x);
  auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * fVar7)),auVar9,auVar9);
  auVar9 = vsqrtss_avx(auVar9,auVar9);
  sVar2 = (this->exitPupilBounds).nStored;
  fVar7 = auVar9._0_4_;
  auVar9 = vcvtusi2ss_avx512f(in_ZMM2._0_16_,sVar2);
  iVar5 = (int)sVar2 + -1;
  iVar6 = (int)((fVar7 / (*(float *)(((this->super_CameraBase).film.
                                      super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits &
                                     0xffffffffffff) + 0x20) * 0.5)) * auVar9._0_4_);
  if (iVar6 <= iVar5) {
    iVar5 = iVar6;
  }
  pBVar1 = (this->exitPupilBounds).ptr + iVar5;
  local_28.pMin.super_Tuple2<pbrt::Point2,_float> = (pBVar1->pMin).super_Tuple2<pbrt::Point2,_float>
  ;
  local_28.pMax.super_Tuple2<pbrt::Point2,_float> = (pBVar1->pMax).super_Tuple2<pbrt::Point2,_float>
  ;
  if (sampleBoundsArea != (Float *)0x0) {
    auVar9._8_8_ = 0;
    auVar9._0_4_ = local_28.pMin.super_Tuple2<pbrt::Point2,_float>.x;
    auVar9._4_4_ = local_28.pMin.super_Tuple2<pbrt::Point2,_float>.y;
    auVar12._8_8_ = 0;
    auVar12._0_4_ = local_28.pMax.super_Tuple2<pbrt::Point2,_float>.x;
    auVar12._4_4_ = local_28.pMax.super_Tuple2<pbrt::Point2,_float>.y;
    auVar12 = vsubps_avx(auVar12,auVar9);
    auVar9 = vmovshdup_avx(auVar12);
    *sampleBoundsArea = auVar12._0_4_ * auVar9._0_4_;
  }
  auVar11._0_8_ = Bounds2<float>::Lerp(&local_28,lensSample);
  auVar11._8_56_ = extraout_var;
  bVar3 = fVar7 != 0.0;
  fVar4 = (float)((uint)bVar3 * (int)((pFilm->super_Tuple2<pbrt::Point2,_float>).y / fVar7));
  auVar8._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar8._0_4_ = fVar4;
  fVar7 = (float)((uint)bVar3 * (int)((pFilm->super_Tuple2<pbrt::Point2,_float>).x / fVar7) +
                 (uint)!bVar3 * 0x3f800000);
  auVar10 = auVar11._0_16_;
  auVar9 = vmovshdup_avx(auVar10);
  auVar12 = vfmsub231ss_fma(ZEXT416((uint)(auVar9._0_4_ * fVar4)),ZEXT416((uint)fVar7),auVar10);
  auVar9 = vfmadd231ss_fma(ZEXT416((uint)(auVar9._0_4_ * fVar7)),auVar8,auVar10);
  auVar9 = vinsertps_avx(auVar12,auVar9,0x10);
  PVar13.super_Tuple3<pbrt::Point3,_float>._0_8_ = auVar9._0_8_;
  PVar13.super_Tuple3<pbrt::Point3,_float>.z =
       (this->elementInterfaces).ptr[(this->elementInterfaces).nStored - 1].thickness;
  return (Point3f)PVar13.super_Tuple3<pbrt::Point3,_float>;
}

Assistant:

Point3f RealisticCamera::SampleExitPupil(const Point2f &pFilm, const Point2f &lensSample,
                                         Float *sampleBoundsArea) const {
    // Find exit pupil bound for sample distance from film center
    Float rFilm = std::sqrt(pFilm.x * pFilm.x + pFilm.y * pFilm.y);
    int rIndex = rFilm / (film.Diagonal() / 2) * exitPupilBounds.size();
    rIndex = std::min<int>(exitPupilBounds.size() - 1, rIndex);
    Bounds2f pupilBounds = exitPupilBounds[rIndex];
    if (sampleBoundsArea != nullptr)
        *sampleBoundsArea = pupilBounds.Area();

    // Generate sample point inside exit pupil bound
    Point2f pLens = pupilBounds.Lerp(lensSample);

    // Return sample point rotated by angle of _pFilm_ with $+x$ axis
    Float sinTheta = (rFilm != 0) ? pFilm.y / rFilm : 0;
    Float cosTheta = (rFilm != 0) ? pFilm.x / rFilm : 1;
    return {cosTheta * pLens.x - sinTheta * pLens.y,
            sinTheta * pLens.x + cosTheta * pLens.y, LensRearZ()};
}